

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<void>::operator()<>
          (Build_Function_Caller_Helper<void> *this)

{
  Type_Conversions *pTVar1;
  Type_Conversions_State state_1;
  Type_Conversions_State state;
  Function_Params local_e8;
  Function_Params local_d8;
  pthread_rwlock_t local_c8;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_48;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> local_20 [2];
  
  pTVar1 = this->m_conversions;
  if (pTVar1 == (Type_Conversions *)0x0) {
    local_78 = &local_88;
    local_88 = 0;
    uStack_80 = 0;
    local_c8._48_8_ = 0;
    uStack_90 = 0;
    local_c8._32_8_ = 0;
    local_c8.__data.__pad2 = 0;
    local_c8._16_8_ = 0;
    local_c8._24_8_ = 0;
    local_c8.__align = 0;
    local_c8._8_8_ = 0;
    local_48 = &local_58;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_70 = local_78;
    local_40 = local_48;
    local_e8.m_end =
         (Boxed_Value *)
         chaiscript::detail::threading::
         Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::operator*(local_20);
    local_e8.m_begin = (Boxed_Value *)&local_c8;
    local_d8.m_begin = (Boxed_Value *)0x0;
    local_d8.m_end = (Boxed_Value *)0x0;
    call(this,&local_d8,(Type_Conversions_State *)&local_e8);
    Type_Conversions::~Type_Conversions((Type_Conversions *)&local_c8.__data);
  }
  else {
    local_c8._8_8_ =
         chaiscript::detail::threading::
         Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::operator*
                   (&pTVar1->m_conversion_saves);
    local_e8.m_begin = (Boxed_Value *)0x0;
    local_e8.m_end = (Boxed_Value *)0x0;
    local_c8.__align = (long)pTVar1;
    call(this,&local_e8,(Type_Conversions_State *)&local_c8.__data);
  }
  return;
}

Assistant:

Ret operator()(P &&...param) {
      std::array<Boxed_Value, sizeof...(P)> params{box<P>(std::forward<P>(param))...};

      if (m_conversions) {
        Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      } else {
        Type_Conversions conv;
        Type_Conversions_State state(conv, conv.conversion_saves());
        return call(chaiscript::Function_Params{params}, state);
      }
    }